

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_requires_argument_exception::~option_requires_argument_exception
          (option_requires_argument_exception *this)

{
  option_requires_argument_exception *this_local;
  
  ~option_requires_argument_exception(this);
  operator_delete(this);
  return;
}

Assistant:

explicit option_requires_argument_exception(const std::string& option)
    : OptionParseException(
        "Option " + LQUOTE + option + RQUOTE + " requires an argument"
      )
    {
    }